

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O2

int secp256k1_borromean_sign
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_ecmult_gen_context *ecmult_gen_ctx,
              uchar *e0,secp256k1_scalar *s,secp256k1_gej *pubs,secp256k1_scalar *k,
              secp256k1_scalar *sec,size_t *rsizes,size_t *secidx,size_t nrings,uchar *m,size_t mlen
              )

{
  int iVar1;
  secp256k1_scalar *psVar2;
  secp256k1_gej *psVar3;
  size_t eidx;
  ulong uVar4;
  size_t sVar5;
  int overflow;
  ulong local_210;
  long local_208;
  size_t size;
  uchar *local_1f8;
  secp256k1_scalar *local_1f0;
  secp256k1_ecmult_context *local_1e8;
  secp256k1_scalar local_1e0;
  secp256k1_scalar *local_1c0;
  secp256k1_gej *local_1b8;
  secp256k1_ecmult_gen_context *local_1b0;
  secp256k1_gej *local_1a8;
  secp256k1_scalar *local_1a0;
  uchar local_198 [40];
  secp256k1_ge rge;
  secp256k1_gej rgej;
  secp256k1_sha256 local_98;
  
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  local_98.bytes = 0;
  local_1a0 = s + 1;
  local_1a8 = pubs + 1;
  local_208 = 0;
  local_1f8 = e0;
  local_1f0 = k;
  local_1e8 = ecmult_ctx;
  local_1c0 = s;
  local_1b8 = pubs;
  local_1b0 = ecmult_gen_ctx;
  for (sVar5 = 0; sVar5 != nrings; sVar5 = sVar5 + 1) {
    secp256k1_ecmult_gen(local_1b0,&rgej,local_1f0 + sVar5);
    secp256k1_ge_set_gej(&rge,&rgej);
    if (rgej.infinity != 0) {
      return 0;
    }
    secp256k1_eckey_pubkey_serialize(&rge,local_198,&size,1);
    uVar4 = secidx[sVar5];
    psVar2 = local_1a0 + local_208 + uVar4;
    psVar3 = local_1a8 + local_208 + uVar4;
    while (uVar4 = uVar4 + 1, uVar4 < rsizes[sVar5]) {
      secp256k1_borromean_hash(local_198,m,mlen,local_198,0x21,sVar5,uVar4);
      secp256k1_scalar_set_b32(&local_1e0,local_198,&overflow);
      if (overflow != 0) {
        return 0;
      }
      if ((local_1e0.d[3] == 0 && local_1e0.d[1] == 0) &&
          (local_1e0.d[2] == 0 && local_1e0.d[0] == 0)) {
        return 0;
      }
      secp256k1_ecmult(local_1e8,&rgej,psVar3,&local_1e0,psVar2);
      if (rgej.infinity != 0) {
        return 0;
      }
      local_210 = uVar4;
      secp256k1_ge_set_gej_var(&rge,&rgej);
      uVar4 = local_210;
      secp256k1_eckey_pubkey_serialize(&rge,local_198,&size,1);
      psVar2 = psVar2 + 1;
      psVar3 = psVar3 + 1;
    }
    secp256k1_sha256_write(&local_98,local_198,size);
    local_208 = local_208 + rsizes[sVar5];
  }
  secp256k1_sha256_write(&local_98,m,mlen);
  secp256k1_sha256_finalize(&local_98,local_1f8);
  sVar5 = 0;
  local_210 = 0;
  do {
    if (sVar5 == nrings) {
      secp256k1_ge_clear(&rge);
      secp256k1_gej_clear(&rgej);
      return 1;
    }
    secp256k1_borromean_hash(local_198,m,mlen,local_1f8,0x20,sVar5,0);
    secp256k1_scalar_set_b32(&local_1e0,local_198,&overflow);
    if (overflow != 0) {
      return 0;
    }
    if ((local_1e0.d[3] == 0 && local_1e0.d[1] == 0) && (local_1e0.d[2] == 0 && local_1e0.d[0] == 0)
       ) {
      return 0;
    }
    psVar2 = local_1c0 + local_210;
    psVar3 = local_1b8 + local_210;
    eidx = 1;
    while (eidx - 1 < secidx[sVar5]) {
      secp256k1_ecmult(local_1e8,&rgej,psVar3,&local_1e0,psVar2);
      if (rgej.infinity != 0) {
        return 0;
      }
      secp256k1_ge_set_gej_var(&rge,&rgej);
      secp256k1_eckey_pubkey_serialize(&rge,local_198,&size,1);
      secp256k1_borromean_hash(local_198,m,mlen,local_198,0x21,sVar5,eidx);
      secp256k1_scalar_set_b32(&local_1e0,local_198,&overflow);
      if (overflow != 0) {
        return 0;
      }
      psVar2 = psVar2 + 1;
      psVar3 = psVar3 + 1;
      eidx = eidx + 1;
      if ((local_1e0.d[3] == 0 && local_1e0.d[1] == 0) &&
          (local_1e0.d[2] == 0 && local_1e0.d[0] == 0)) {
        return 0;
      }
    }
    secp256k1_scalar_mul(psVar2,&local_1e0,sec + sVar5);
    secp256k1_scalar_negate(psVar2,psVar2);
    secp256k1_scalar_add(psVar2,psVar2,local_1f0 + sVar5);
    iVar1 = secp256k1_scalar_is_zero(psVar2);
    if (iVar1 != 0) {
      return 0;
    }
    local_210 = local_210 + rsizes[sVar5];
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

int secp256k1_borromean_sign(const secp256k1_ecmult_context* ecmult_ctx, const secp256k1_ecmult_gen_context *ecmult_gen_ctx,
 unsigned char *e0, secp256k1_scalar *s, const secp256k1_gej *pubs, const secp256k1_scalar *k, const secp256k1_scalar *sec,
 const size_t *rsizes, const size_t *secidx, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_ctx != NULL);
    VERIFY_CHECK(ecmult_gen_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(k != NULL);
    VERIFY_CHECK(sec != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(secidx != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    secp256k1_sha256_initialize(&sha256_e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_ecmult_gen(ecmult_gen_ctx, &rgej, &k[i]);
        secp256k1_ge_set_gej(&rge, &rgej);
        if (secp256k1_gej_is_infinity(&rgej)) {
            return 0;
        }
        secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        for (j = secidx[i] + 1; j < rsizes[i]; j++) {
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
            /** The signing algorithm as a whole is not memory uniform so there is likely a cache sidechannel that
             *  leaks which members are non-forgeries. That the forgeries themselves are variable time may leave
             *  an additional privacy impacting timing side-channel, but not a key loss one.
             */
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        }
        secp256k1_sha256_write(&sha256_e0, tmp, size);
        count += rsizes[i];
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ens)) {
            return 0;
        }
        for (j = 0; j < secidx[i]; j++) {
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
        }
        secp256k1_scalar_mul(&s[count + j], &ens, &sec[i]);
        secp256k1_scalar_negate(&s[count + j], &s[count + j]);
        secp256k1_scalar_add(&s[count + j], &s[count + j], &k[i]);
        if (secp256k1_scalar_is_zero(&s[count + j])) {
            return 0;
        }
        count += rsizes[i];
    }
    secp256k1_scalar_clear(&ens);
    secp256k1_ge_clear(&rge);
    secp256k1_gej_clear(&rgej);
    memset(tmp, 0, 33);
    return 1;
}